

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

int __thiscall soul::Module::Structs::remove(Structs *this,char *__filename)

{
  RefCountedPtr<soul::Structure> *startElement;
  RefCountedPtr<soul::Structure> *extraout_RAX;
  RefCountedPtr<soul::Structure> *pRVar1;
  RefCountedPtr<soul::Structure> *pRVar2;
  
  pRVar1 = (this->structs).items;
  startElement = std::
                 __find_if<soul::RefCountedPtr<soul::Structure>*,__gnu_cxx::__ops::_Iter_equals_val<soul::Structure_const>>
                           (pRVar1,pRVar1 + (this->structs).numActive,__filename);
  pRVar2 = (this->structs).items + (this->structs).numActive;
  pRVar1 = startElement;
  if (startElement != pRVar2) {
    ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL>::erase
              (&this->structs,startElement,startElement + 1);
    pRVar1 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)pRVar1 >> 8),startElement != pRVar2);
}

Assistant:

bool Module::Structs::remove (Structure& s)
{
    return removeItem (structs, s);
}